

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserClass.cc
# Opt level: O2

void __thiscall ParserClass::readInput(ParserClass *this)

{
  bool bVar1;
  bool bVar2;
  string *line_00;
  int theNum;
  string nextLine;
  string line;
  int local_10c;
  string *local_108;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_100;
  string *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_d0);
  local_108 = (string *)&(this->inputs).having_conds;
  local_100 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &(this->inputs).cond_vars;
  local_f8 = (string *)&(this->inputs).group_var;
  bVar1 = false;
LAB_00103aa6:
  do {
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      return;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_d0);
    bVar2 = std::operator==(&local_d0,SELECT_VAR);
    if (bVar2) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&local_f0);
      std::__cxx11::string::string((string *)&local_50,(string *)&local_f0);
      line_00 = &local_50;
      setSelectVar(this,line_00);
LAB_00103afc:
      std::__cxx11::string::~string((string *)line_00);
      goto LAB_00103aa6;
    }
    bVar2 = std::operator==(&local_d0,NUM_OF_GROUPING);
    if (bVar2) {
      std::istream::operator>>((istream *)&std::cin,&local_10c);
      (this->inputs).num = local_10c;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&local_d0);
    }
    else {
      bVar2 = std::operator==(&local_d0,GROUPING_ATTRIBUTE);
      if (bVar2) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&std::cin,(string *)&local_f0);
        std::__cxx11::string::_M_assign(local_f8);
      }
      else {
        bVar2 = std::operator==(&local_d0,AGG_FUNCS);
        if (bVar2) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&std::cin,(string *)&local_f0);
          std::__cxx11::string::string((string *)&local_70,(string *)&local_f0);
          line_00 = &local_70;
          setAggFunc(this,line_00);
          goto LAB_00103afc;
        }
        bVar2 = std::operator==(&local_d0,SELECT_CONDS);
        if (bVar2) {
          do {
            bVar2 = std::operator!=(&local_f0,HAVING_CONDS);
            if (bVar2) {
              std::__cxx11::string::string((string *)&local_90,(string *)&local_f0);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string&>(local_100,&local_90);
              std::__cxx11::string::~string((string *)&local_90);
            }
            else {
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&std::cin,(string *)&local_f0);
              if (local_f0._M_dataplus._M_p[local_f0._M_string_length - 1] == ';') {
                std::__cxx11::string::pop_back();
                bVar1 = true;
              }
              std::__cxx11::string::string(local_b0,(string *)&local_f0);
              std::__cxx11::string::_M_assign(local_108);
              std::__cxx11::string::~string(local_b0);
              if (bVar1) break;
            }
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&std::cin,(string *)&local_f0);
          } while( true );
        }
      }
    }
  } while( true );
}

Assistant:

void ParserClass::readInput()
{
    std::string line;
    std::string nextLine;
    getline(std::cin, line);
    bool flag = false;
    while(true)
    {
        if (flag)
            break;
        getline(std::cin, line);
        if (line == ParserClass::SELECT_VAR)
        {
            getline(std::cin, nextLine);
            this->setSelectVar(nextLine);
        }
        else if (line == ParserClass::NUM_OF_GROUPING)
        {
            int theNum;
            std::cin >> theNum;
            this->inputs.num = theNum;
            getline(std::cin, line);
        }
        else if (line == ParserClass::GROUPING_ATTRIBUTE)
        {
            getline(std::cin, nextLine);
            this->inputs.group_var = nextLine;
        }
        else if (line == ParserClass::AGG_FUNCS)
        {
            getline(std::cin, nextLine);
            this->setAggFunc(nextLine);
        }
        else if (line == ParserClass::SELECT_CONDS)
        {
            /*
             * The number of lines in SELECT CONDITION-VECT([σ]) is unknown.
             * So we parse SELECT COND and HAVING COND together. 
             */
            do
            {
                if (nextLine != ParserClass::HAVING_CONDS)
                    this->setSelectCond(nextLine);
                else
                {
                    getline(std::cin, nextLine);
                    if (nextLine.back() == ';')
                    {
                        nextLine.pop_back();
                        flag = true;
                    }
                    this->setHavingCond(nextLine);
                    if (flag)
                        break;
                }
                getline(std::cin, nextLine);
            } while (true);
        }
    }
}